

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

void Acb_DeriveCnfForNode(Acb_Ntk_t *p,int iObj,sat_solver *pSat,int OutVar)

{
  Vec_Int_t *p_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  Vec_Int_t *vClas;
  int *piVar7;
  Vec_Int_t *vLits;
  long lVar8;
  char *__assertion;
  long lVar9;
  
  vClas = (Vec_Int_t *)malloc(0x10);
  vClas->nCap = 100;
  vClas->nSize = 0;
  piVar7 = (int *)malloc(400);
  vClas->pArray = piVar7;
  vLits = (Vec_Int_t *)malloc(0x10);
  vLits->nCap = 100;
  vLits->nSize = 0;
  piVar7 = (int *)malloc(400);
  vLits->pArray = piVar7;
  (p->vCover).nSize = 0;
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  if ((p->vObjFans).nSize <= iObj) {
LAB_003a190b:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar1 = (p->vObjFans).pArray[(uint)iObj];
  lVar8 = (long)iVar1;
  if ((lVar8 < 0) || ((p->vFanSto).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  p_00 = &p->vCover;
  piVar7 = (p->vFanSto).pArray;
  if (0 < piVar7[lVar8]) {
    lVar9 = 0;
    do {
      uVar2 = piVar7[lVar8 + lVar9 + 1];
      if ((long)(int)uVar2 < 1) {
        __assertion = "i>0";
LAB_003a1959:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0x109,"int Acb_ObjFunc(Acb_Ntk_t *, int)");
      }
      uVar3 = (p->vObjFunc).nSize;
      if ((int)uVar3 < 1) {
        __assertion = "Acb_NtkHasObjFuncs(p)";
        goto LAB_003a1959;
      }
      if (uVar3 <= uVar2) goto LAB_003a190b;
      iVar1 = (p->vObjFunc).pArray[(int)uVar2];
      if (iVar1 < 0) {
        __assert_fail("Acb_ObjFunc(p, iFanin) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                      ,0xad,"void Acb_DeriveCnfForNode(Acb_Ntk_t *, int, sat_solver *, int)");
      }
      lVar9 = lVar9 + 1;
      Vec_IntPush(p_00,iVar1);
    } while (lVar9 < piVar7[lVar8]);
  }
  Vec_IntPush(p_00,OutVar);
  if ((p->vCnfs).nSize <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  Acb_TranslateCnf(vClas,vLits,(Vec_Str_t *)((p->vCnfs).pArray + (uint)iObj),p_00,-1);
  iVar1 = vClas->nSize;
  piVar7 = vClas->pArray;
  if ((long)iVar1 < 1) {
    if (piVar7 == (int *)0x0) goto LAB_003a18d8;
  }
  else {
    piVar5 = vLits->pArray;
    lVar8 = 0;
    iVar6 = 0;
    do {
      iVar4 = piVar7[lVar8];
      iVar6 = sat_solver_addclause(pSat,piVar5 + iVar6,piVar5 + iVar4);
      if (iVar6 == 0) {
        puts("Error: SAT solver became UNSAT at a wrong place (while adding new CNF).");
      }
      lVar8 = lVar8 + 1;
      iVar6 = iVar4;
    } while (iVar1 != lVar8);
  }
  free(piVar7);
LAB_003a18d8:
  free(vClas);
  if (vLits->pArray != (int *)0x0) {
    free(vLits->pArray);
  }
  free(vLits);
  return;
}

Assistant:

void Acb_DeriveCnfForNode( Acb_Ntk_t * p, int iObj, sat_solver * pSat, int OutVar )
{
    Vec_Wec_t * vCnfs = &p->vCnfs;
    Vec_Int_t * vFaninVars = &p->vCover;
    Vec_Int_t * vClas = Vec_IntAlloc( 100 );
    Vec_Int_t * vLits = Vec_IntAlloc( 100 );
    int k, iFanin, * pFanins, Prev, This;
    // collect SAT variables
    Vec_IntClear( vFaninVars );
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
    {
        assert( Acb_ObjFunc(p, iFanin) >= 0 );
        Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iFanin) );
    }
    Vec_IntPush( vFaninVars, OutVar );
    // derive CNF for the node
    Acb_TranslateCnf( vClas, vLits, (Vec_Str_t *)Vec_WecEntry(vCnfs, iObj), vFaninVars, -1 );
    // add clauses
    Prev = 0;
    Vec_IntForEachEntry( vClas, This, k )
    {
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vLits) + Prev, Vec_IntArray(vLits) + This ) )
            printf( "Error: SAT solver became UNSAT at a wrong place (while adding new CNF).\n" );
        Prev = This;
    }
    Vec_IntFree( vClas );
    Vec_IntFree( vLits );
}